

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,
          formatDefinition *texture_format,resolutionDefinition *resolution,bool mutability)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  ulong uVar7;
  sockaddr *__addr;
  GLint mipmap_level_1;
  int n_mipmap_levels;
  uint uVar8;
  uint uVar9;
  GLint mipmap_level;
  GLint face;
  int cube_face;
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iStack_50;
  int iStack_4c;
  undefined8 local_48;
  Functions *gl;
  
  uVar3 = resolution->m_depth;
  uVar9 = resolution->m_width;
  uVar8 = resolution->m_height;
  if ((int)resolution->m_height < (int)uVar9) {
    uVar8 = uVar9;
  }
  n_mipmap_levels = 1;
  if (1 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
    do {
      uVar7 = uVar7 >> 1;
      n_mipmap_levels = n_mipmap_levels + 1;
      uVar9 = (uint)uVar7;
      bVar4 = 3 < uVar8;
      uVar8 = uVar9;
    } while (bVar4);
  }
  uVar8 = uVar3 / 6;
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  textureDefinition::bind(texture,0x9009,__addr,uVar9);
  if (mutability) {
    uVar1 = resolution->m_width;
    uVar2 = resolution->m_height;
    auVar12._4_4_ = uVar2;
    auVar12._0_4_ = uVar1;
    auVar12._8_8_ = 0;
    iVar5 = 0;
    do {
      (*gl->texImage3D)(0x9009,iVar5,(texture_format->m_source).m_internal_format,auVar12._0_4_,
                        auVar12._4_4_,resolution->m_depth,0,(texture_format->m_source).m_format,
                        (texture_format->m_source).m_type,(void *)0x0);
      iStack_50 = auVar12._8_4_;
      iStack_4c = auVar12._12_4_;
      auVar10._0_4_ = auVar12._0_4_ / 2;
      auVar10._4_4_ = auVar12._4_4_ / 2;
      auVar10._8_4_ = iStack_50 / 2;
      auVar10._12_4_ = iStack_4c / 2;
      auVar13._0_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[0] < auVar10._0_4_);
      auVar13._4_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[1] < auVar10._4_4_);
      auVar13._8_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[2] < auVar10._8_4_);
      auVar13._12_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[3] < auVar10._12_4_);
      auVar12 = ~auVar13 &
                (undefined1  [16])
                GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                gather_offsets_y | auVar10 & auVar13;
      iVar5 = iVar5 + 1;
    } while (n_mipmap_levels != iVar5);
  }
  else {
    (*gl->texStorage3D)(0x9009,n_mipmap_levels,(texture_format->m_source).m_internal_format,
                        resolution->m_width,resolution->m_height,resolution->m_depth);
  }
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to allocate storage for texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0xda0);
  local_48._0_4_ = resolution->m_width;
  local_48._4_4_ = resolution->m_height;
  iVar5 = 0;
  do {
    if (5 < uVar3) {
      uVar9 = 0;
      do {
        cube_face = 0;
        do {
          prepareTextureFace(gl,cube_face,uVar9,iVar5,uVar8,n_mipmap_levels,
                             (texture_format->m_source).m_format,(texture_format->m_source).m_type,
                             (int)local_48,local_48._4_4_);
          cube_face = cube_face + 1;
        } while (cube_face != 6);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar8);
    }
    uVar9 = (int)local_48 / 2;
    uVar11 = -(uint)(1 < (int)uVar9);
    uVar14 = -(uint)(1 < local_48._4_4_ / 2);
    local_48 = CONCAT44(~uVar14 & 1 | local_48._4_4_ / 2 & uVar14,~uVar11 & 1 | uVar9 & uVar11);
    iVar5 = iVar5 + 1;
  } while (iVar5 != n_mipmap_levels);
  GVar6 = (texture_format->m_source).m_internal_format;
  uVar3 = GVar6 - 0x8d48;
  if (((0x3a < uVar3) || ((0x400010000000001U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
     (GVar6 != 0x8cac)) {
    return;
  }
  (*gl->texParameteri)(0x9009,0x2800,0x2600);
  (*gl->texParameteri)(0x9009,0x2801,0x2700);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareTexture(const textureDefinition&	texture,
													 const formatDefinition&	 texture_format,
													 const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint n_elements		 = resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, texture_format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, texture_format.m_source.m_internal_format,
						  texture_width, texture_height, resolution.m_depth, 0 /* border */,
						  texture_format.m_source.m_format, texture_format.m_source.m_type, 0 /* data */);

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to allocate storage for texture");

	texture_width  = resolution.m_width;
	texture_height = resolution.m_height;

	for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
	{
		for (glw::GLint element_index = 0; element_index < n_elements; ++element_index)
		{
			for (glw::GLint face = 0; face < n_faces; ++face)
			{
				prepareTextureFace(gl, face, element_index, mipmap_level, n_elements, n_mipmap_levels,
								   texture_format.m_source.m_format, texture_format.m_source.m_type, texture_width,
								   texture_height);
			}
		}

		texture_width  = de::max(1, texture_width / 2);
		texture_height = de::max(1, texture_height / 2);
	}

	// not texture filterable formats
	if ((texture_format.m_source.m_internal_format == GL_RGBA32UI) ||
		(texture_format.m_source.m_internal_format == GL_RGBA32I) ||
		(texture_format.m_source.m_internal_format == GL_STENCIL_INDEX8) ||
		(texture_format.m_source.m_internal_format == GL_DEPTH_COMPONENT32F))
	{
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	}
}